

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O2

wchar_t read_body_to_string(archive_read *a,tar *tar,archive_string *as,void *h,size_t *unconsumed)

{
  int error_number;
  ulong __n;
  archive_string *paVar1;
  void *__src;
  char *fmt;
  ulong min;
  
  __n = tar_atol((char *)((long)&as[5].s + 4),0xc);
  if (__n < 0x100001) {
    paVar1 = archive_string_ensure(&tar->acl_text,__n + 1);
    if (paVar1 != (archive_string *)0x0) {
      tar_flush_unconsumed(a,(size_t *)h);
      min = (ulong)((int)__n + 0x1ffU & 0x3ffe00);
      *(ulong *)h = min;
      __src = __archive_read_ahead(a,min,(ssize_t *)0x0);
      if (__src == (void *)0x0) {
        *(undefined8 *)h = 0;
        return L'\xffffffe2';
      }
      memcpy((tar->acl_text).s,__src,__n);
      (tar->acl_text).s[__n] = '\0';
      (tar->acl_text).length = __n;
      return L'\0';
    }
    fmt = "No memory";
    error_number = 0xc;
  }
  else {
    fmt = "Special header too large";
    error_number = 0x16;
  }
  archive_set_error(&a->archive,error_number,fmt);
  return L'\xffffffe2';
}

Assistant:

static int
read_body_to_string(struct archive_read *a, struct tar *tar,
    struct archive_string *as, const void *h, size_t *unconsumed)
{
	int64_t size;
	const struct archive_entry_header_ustar *header;
	const void *src;

	(void)tar; /* UNUSED */
	header = (const struct archive_entry_header_ustar *)h;
	size  = tar_atol(header->size, sizeof(header->size));
	if ((size > 1048576) || (size < 0)) {
		archive_set_error(&a->archive, EINVAL,
		    "Special header too large");
		return (ARCHIVE_FATAL);
	}

	/* Fail if we can't make our buffer big enough. */
	if (archive_string_ensure(as, (size_t)size+1) == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "No memory");
		return (ARCHIVE_FATAL);
	}

	tar_flush_unconsumed(a, unconsumed);

	/* Read the body into the string. */
	*unconsumed = (size_t)((size + 511) & ~ 511);
	src = __archive_read_ahead(a, *unconsumed, NULL);
	if (src == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	memcpy(as->s, src, (size_t)size);
	as->s[size] = '\0';
	as->length = (size_t)size;
	return (ARCHIVE_OK);
}